

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector_senswrapper.c
# Opt level: O1

N_Vector N_VNewEmpty_SensWrapper(int nvecs,SUNContext_conflict sunctx)

{
  N_Vector_Ops p_Var1;
  N_Vector v;
  long *__ptr;
  void *pvVar2;
  ulong uVar3;
  
  if (0 < nvecs) {
    v = N_VNewEmpty(sunctx);
    if (v != (N_Vector)0x0) {
      p_Var1 = v->ops;
      p_Var1->nvclone = N_VClone_SensWrapper;
      p_Var1->nvcloneempty = N_VCloneEmpty_SensWrapper;
      p_Var1->nvdestroy = N_VDestroy_SensWrapper;
      p_Var1->nvlinearsum = N_VLinearSum_SensWrapper;
      p_Var1->nvconst = N_VConst_SensWrapper;
      p_Var1->nvprod = N_VProd_SensWrapper;
      p_Var1->nvdiv = N_VDiv_SensWrapper;
      p_Var1->nvscale = N_VScale_SensWrapper;
      p_Var1->nvabs = N_VAbs_SensWrapper;
      p_Var1->nvinv = N_VInv_SensWrapper;
      p_Var1->nvaddconst = N_VAddConst_SensWrapper;
      p_Var1->nvdotprod = N_VDotProd_SensWrapper;
      p_Var1->nvmaxnorm = N_VMaxNorm_SensWrapper;
      p_Var1->nvwrmsnormmask = N_VWrmsNormMask_SensWrapper;
      p_Var1->nvwrmsnorm = N_VWrmsNorm_SensWrapper;
      p_Var1->nvmin = N_VMin_SensWrapper;
      p_Var1->nvwl2norm = N_VWL2Norm_SensWrapper;
      p_Var1->nvl1norm = N_VL1Norm_SensWrapper;
      p_Var1->nvcompare = N_VCompare_SensWrapper;
      p_Var1->nvinvtest = N_VInvTest_SensWrapper;
      p_Var1->nvconstrmask = N_VConstrMask_SensWrapper;
      p_Var1->nvminquotient = N_VMinQuotient_SensWrapper;
      __ptr = (long *)malloc(0x10);
      if (__ptr != (long *)0x0) {
        *(int *)(__ptr + 1) = nvecs;
        *(undefined4 *)((long)__ptr + 0xc) = 0;
        *__ptr = 0;
        pvVar2 = malloc((ulong)(uint)nvecs * 8);
        *__ptr = (long)pvVar2;
        if (pvVar2 != (void *)0x0) {
          uVar3 = 0;
          do {
            *(undefined8 *)(*__ptr + uVar3 * 8) = 0;
            uVar3 = uVar3 + 1;
          } while ((uint)nvecs != uVar3);
          v->content = __ptr;
          return v;
        }
        free(__ptr);
      }
      N_VFreeEmpty(v);
    }
  }
  return (N_Vector)0x0;
}

Assistant:

N_Vector N_VNewEmpty_SensWrapper(int nvecs, SUNContext sunctx)
{
  int i;
  N_Vector v;
  N_VectorContent_SensWrapper content;

  /* return if wrapper is empty */
  if (nvecs < 1) { return (NULL); }

  /* Create an empty vector object */
  v = NULL;
  v = N_VNewEmpty(sunctx);
  if (v == NULL) { return (NULL); }

  /* Attach operations */

  v->ops->nvclone      = N_VClone_SensWrapper;
  v->ops->nvcloneempty = N_VCloneEmpty_SensWrapper;
  v->ops->nvdestroy    = N_VDestroy_SensWrapper;

  /* standard vector operations */
  v->ops->nvlinearsum    = N_VLinearSum_SensWrapper;
  v->ops->nvconst        = N_VConst_SensWrapper;
  v->ops->nvprod         = N_VProd_SensWrapper;
  v->ops->nvdiv          = N_VDiv_SensWrapper;
  v->ops->nvscale        = N_VScale_SensWrapper;
  v->ops->nvabs          = N_VAbs_SensWrapper;
  v->ops->nvinv          = N_VInv_SensWrapper;
  v->ops->nvaddconst     = N_VAddConst_SensWrapper;
  v->ops->nvdotprod      = N_VDotProd_SensWrapper;
  v->ops->nvmaxnorm      = N_VMaxNorm_SensWrapper;
  v->ops->nvwrmsnormmask = N_VWrmsNormMask_SensWrapper;
  v->ops->nvwrmsnorm     = N_VWrmsNorm_SensWrapper;
  v->ops->nvmin          = N_VMin_SensWrapper;
  v->ops->nvwl2norm      = N_VWL2Norm_SensWrapper;
  v->ops->nvl1norm       = N_VL1Norm_SensWrapper;
  v->ops->nvcompare      = N_VCompare_SensWrapper;
  v->ops->nvinvtest      = N_VInvTest_SensWrapper;
  v->ops->nvconstrmask   = N_VConstrMask_SensWrapper;
  v->ops->nvminquotient  = N_VMinQuotient_SensWrapper;

  /* create content */
  content = NULL;
  content = (N_VectorContent_SensWrapper)malloc(sizeof *content);
  if (content == NULL)
  {
    N_VFreeEmpty(v);
    return (NULL);
  }

  content->nvecs    = nvecs;
  content->own_vecs = SUNFALSE;
  content->vecs     = NULL;
  content->vecs     = (N_Vector*)malloc(nvecs * sizeof(N_Vector));
  if (content->vecs == NULL)
  {
    free(content);
    N_VFreeEmpty(v);
    return (NULL);
  }

  /* initialize vector array to null */
  for (i = 0; i < nvecs; i++) { content->vecs[i] = NULL; }

  /* attach content */
  v->content = content;

  return (v);
}